

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O0

void publickey_status_error(LIBSSH2_PUBLICKEY *pkey,LIBSSH2_SESSION *session,unsigned_long status)

{
  char *local_28;
  char *msg;
  unsigned_long status_local;
  LIBSSH2_SESSION *session_local;
  LIBSSH2_PUBLICKEY *pkey_local;
  
  msg = (char *)status;
  if (((status == 6) && (pkey != (LIBSSH2_PUBLICKEY *)0x0)) && (pkey->version == 1)) {
    msg = (char *)0x7;
  }
  if (msg < (char *)0x9) {
    local_28 = publickey_status_codes[(long)msg].name;
  }
  else {
    local_28 = "unknown";
  }
  _libssh2_error(session,-0x24,local_28);
  return;
}

Assistant:

static void
publickey_status_error(const LIBSSH2_PUBLICKEY *pkey,
                       LIBSSH2_SESSION *session, unsigned long status)
{
    const char *msg;

    /* GENERAL_FAILURE got remapped between version 1 and 2 */
    if(status == 6 && pkey && pkey->version == 1) {
        status = 7;
    }

    if(status > LIBSSH2_PUBLICKEY_STATUS_CODE_MAX) {
        msg = "unknown";
    }
    else {
        msg = publickey_status_codes[status].name;
    }

    _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL, msg);
}